

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

longlong LDSketch_up_estimate(LDSketch_t *sk,uchar *key)

{
  longlong lVar1;
  uchar *in_RDI;
  dyn_tbl_t *unaff_retaddr;
  int index;
  int i;
  longlong ret;
  int k;
  uchar *in_stack_00000038;
  LDSketch_t *in_stack_00000040;
  longlong local_38;
  int local_24;
  long local_20;
  
  LDSketch_find(in_stack_00000040,in_stack_00000038,sk._4_4_,(int)sk,key._4_4_);
  local_20 = dyn_tbl_up_estimate(unaff_retaddr,in_RDI);
  for (local_24 = 1; local_24 < *(int *)(in_RDI + 8); local_24 = local_24 + 1) {
    LDSketch_find(in_stack_00000040,in_stack_00000038,sk._4_4_,(int)sk,key._4_4_);
    lVar1 = dyn_tbl_up_estimate(unaff_retaddr,in_RDI);
    if (local_20 < lVar1) {
      local_38 = local_20;
    }
    else {
      local_38 = dyn_tbl_up_estimate(unaff_retaddr,in_RDI);
    }
    local_20 = local_38;
  }
  return local_20;
}

Assistant:

long long LDSketch_up_estimate(LDSketch_t* sk, unsigned char* key) {
	int k = LDSketch_find(sk, key, 0, sk->lgn - 1, 0);
	long long ret = dyn_tbl_up_estimate(sk->tbl[k], key);
	for (int i = 1; i < sk->h; ++i) {
		k = LDSketch_find(sk, key, 0, sk->lgn - 1, i);
		int index = i * sk->w + k;
		ret = MIN(ret, dyn_tbl_up_estimate(sk->tbl[index], key));
	}
	return ret;
}